

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidgetItem::setFlags(QTreeWidgetItem *this,ItemFlags flags)

{
  byte bVar1;
  QTreeWidgetItem *pQVar2;
  QTreeWidgetItem *this_00;
  Int IVar3;
  bool bVar4;
  iterator iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QArrayData *local_58;
  undefined8 uStack_50;
  long local_48;
  QTreeWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = (uint)flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
          & 0x20;
  IVar3 = (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
          super_QFlagsStorage<Qt::ItemFlag>.i;
  bVar4 = SUB41(uVar8 >> 5,0);
  bVar1 = this->d->field_0x20;
  this->d->field_0x20 = bVar1 & 0xfe | uVar8 == 0;
  if (((uVar8 != 0) && (this->par != (QTreeWidgetItem *)0x0)) &&
     (((this->par->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
       super_QFlagsStorage<Qt::ItemFlag>.i & 0x20) == 0)) {
    flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorageHelper<Qt::ItemFlag,_4>)
         (QFlagsStorageHelper<Qt::ItemFlag,_4>)
         ((uint)flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
         & 0xffffffdf);
  }
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  if (((IVar3 & 0x20) == 0) == bVar4 && ((bVar4 ^ bVar1) & 1) == 0) {
    local_58 = (QArrayData *)0x0;
    uStack_50 = 0;
    local_48 = 0;
    local_40 = this;
    QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
              ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,0,&local_40);
    QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
    if (local_48 != 0) {
      do {
        iVar5 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
        pQVar2 = iVar5.i[-1];
        local_48 = local_48 + -1;
        uVar6 = (pQVar2->children).d.size;
        if (uVar6 != 0) {
          uVar7 = 0;
          do {
            this_00 = (pQVar2->children).d.ptr[uVar7];
            if ((this_00->d->field_0x20 & 1) == 0) {
              local_40 = this_00;
              QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                        ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,local_48,&local_40);
              QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
              (this_00->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i =
                   (this_00->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                   super_QFlagsStorage<Qt::ItemFlag>.i & 0xffffffdf | uVar8;
              itemChanged(this_00);
              uVar6 = (pQVar2->children).d.size;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar6);
        }
      } while (local_48 != 0);
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,8,0x10);
      }
    }
  }
  itemChanged(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setFlags(Qt::ItemFlags flags)
{
    const bool enable = (flags & Qt::ItemIsEnabled);
    const bool changedState = bool(itemFlags & Qt::ItemIsEnabled) != enable;
    const bool changedExplicit = d->disabled != !enable;

    d->disabled = !enable;

    if (enable && par && !(par->itemFlags & Qt::ItemIsEnabled)) // inherit from parent
        itemFlags = flags & ~Qt::ItemIsEnabled;
    else // this item is explicitly disabled or has no parent
        itemFlags = flags;

    if (changedState && changedExplicit) { // if the propagate the change to the children
        QStack<QTreeWidgetItem*> parents;
        parents.push(this);
        while (!parents.isEmpty()) {
            QTreeWidgetItem *parent = parents.pop();
            for (int i = 0; i < parent->children.size(); ++i) {
                QTreeWidgetItem *child = parent->children.at(i);
                if (!child->d->disabled) { // if not explicitly disabled
                    parents.push(child);
                    if (enable)
                        child->itemFlags = child->itemFlags | Qt::ItemIsEnabled;
                    else
                        child->itemFlags = child->itemFlags & ~Qt::ItemIsEnabled;
                    child->itemChanged(); // ### we may want to optimize this
                }
            }
        }
    }
    itemChanged();
}